

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void substSelect(SubstContext *pSubst,Select *p,int doPrior)

{
  ushort uVar1;
  Expr *pEVar2;
  ushort *puVar3;
  int iVar4;
  
  if (p != (Select *)0x0) {
    do {
      substExprList(pSubst,p->pEList);
      substExprList(pSubst,p->pGroupBy);
      substExprList(pSubst,p->pOrderBy);
      pEVar2 = substExpr(pSubst,p->pHaving);
      p->pHaving = pEVar2;
      pEVar2 = substExpr(pSubst,p->pWhere);
      p->pWhere = pEVar2;
      puVar3 = (ushort *)&p->pSrc->a[0].fg.field_0x1;
      for (iVar4 = p->pSrc->nSrc; 0 < iVar4; iVar4 = iVar4 + -1) {
        uVar1 = *puVar3;
        if ((uVar1 & 4) != 0) {
          substSelect(pSubst,(Select *)**(undefined8 **)((long)puVar3 + 0x27),1);
          uVar1 = *puVar3;
        }
        if ((uVar1 & 8) != 0) {
          substExprList(pSubst,*(ExprList **)((long)puVar3 + 0xf));
        }
        puVar3 = puVar3 + 0x24;
      }
    } while ((doPrior != 0) && (p = p->pPrior, p != (Select *)0x0));
  }
  return;
}

Assistant:

static void substSelect(
  SubstContext *pSubst, /* Description of the substitution */
  Select *p,            /* SELECT statement in which to make substitutions */
  int doPrior           /* Do substitutes on p->pPrior too */
){
  SrcList *pSrc;
  SrcItem *pItem;
  int i;
  if( !p ) return;
  do{
    substExprList(pSubst, p->pEList);
    substExprList(pSubst, p->pGroupBy);
    substExprList(pSubst, p->pOrderBy);
    p->pHaving = substExpr(pSubst, p->pHaving);
    p->pWhere = substExpr(pSubst, p->pWhere);
    pSrc = p->pSrc;
    assert( pSrc!=0 );
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      if( pItem->fg.isSubquery ){
        substSelect(pSubst, pItem->u4.pSubq->pSelect, 1);
      }
      if( pItem->fg.isTabFunc ){
        substExprList(pSubst, pItem->u1.pFuncArg);
      }
    }
  }while( doPrior && (p = p->pPrior)!=0 );
}